

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  string *output;
  LocationRecorder location;
  
  bVar1 = Consume(this,"message");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,message_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&message->super_Message,NAME);
    output = DescriptorProto::mutable_name_abi_cxx11_(message);
    bVar1 = ConsumeIdentifier(this,output,"Expected message name.");
    LocationRecorder::~LocationRecorder(&location);
    if (bVar1) {
      bVar1 = ParseMessageBlock(this,message,message_location);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseMessageDefinition(DescriptorProto* message,
                                    const LocationRecorder& message_location) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        message, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
  }
  DO(ParseMessageBlock(message, message_location));
  return true;
}